

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

base_learner * GD::setup(options_i *options,vw *all)

{
  element_type *peVar1;
  _func_float_gd_ptr_base_learner_ptr_example_ptr *p_Var2;
  undefined8 uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  option_group_definition *poVar7;
  typed_option<float> *op;
  typed_option<double> *ptVar8;
  typed_option<unsigned_long> *ptVar9;
  element_type eVar10;
  ostream *poVar11;
  code *pcVar12;
  uint64_t uVar13;
  learner<GD::gd,_example> *plVar14;
  vw_exception *this;
  code *pcVar15;
  uint32_t *puVar16;
  code *pcVar17;
  bool bVar18;
  bool bVar19;
  float fVar20;
  double dVar21;
  bool normalized;
  bool invariant;
  bool adax;
  bool adaptive;
  bool sgd;
  allocator local_8a8;
  allocator local_8a7;
  allocator local_8a6;
  allocator local_8a5;
  allocator local_8a4;
  allocator local_8a3;
  allocator local_8a2;
  allocator local_8a1;
  allocator local_8a0;
  allocator local_89f;
  allocator local_89e;
  allocator local_89d;
  allocator local_89c;
  allocator local_89b;
  allocator local_89a;
  allocator local_899;
  free_ptr<GD::gd> g;
  string local_888 [32];
  string local_868;
  string local_848 [32];
  string local_828;
  string local_808 [32];
  string local_7e8;
  string local_7c8 [32];
  string local_7a8;
  string local_788 [32];
  string local_768;
  string local_748 [32];
  string local_728;
  string local_708 [32];
  string local_6e8;
  string local_6c8 [32];
  string local_6a8;
  string local_688;
  string local_668;
  option_group_definition new_options;
  undefined1 local_610 [160];
  stringstream __msg;
  undefined1 local_560 [376];
  undefined1 local_3e8 [160];
  undefined1 local_348 [160];
  undefined1 local_2a8 [160];
  typed_option<double> local_208;
  typed_option<double> local_168;
  typed_option<float> local_c8;
  
  scoped_calloc_or_throw<GD::gd>();
  sgd = false;
  adaptive = false;
  adax = false;
  invariant = false;
  normalized = false;
  std::__cxx11::string::string((string *)&local_688,"Gradient Descent options",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_688);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::string((string *)&local_6a8,"sgd",&local_899);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)&__msg,&local_6a8,&sgd);
  std::__cxx11::string::string
            (local_6c8,"use regular stochastic gradient descent update.",&local_89a);
  std::__cxx11::string::_M_assign((string *)(local_560 + 0x20));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&new_options,(typed_option<bool> *)&__msg);
  std::__cxx11::string::string((string *)&local_6e8,"adaptive",&local_89b);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_610,&local_6e8,&adaptive)
  ;
  std::__cxx11::string::string(local_708,"use adaptive, individual learning rates.",&local_89c);
  std::__cxx11::string::_M_assign((string *)(local_610 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_610);
  std::__cxx11::string::string((string *)&local_728,"adax",&local_89d);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_348,&local_728,&adax);
  std::__cxx11::string::string
            (local_748,"use adaptive learning rates with x^2 instead of g^2x^2",&local_89e);
  std::__cxx11::string::_M_assign((string *)(local_348 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_348);
  std::__cxx11::string::string((string *)&local_768,"invariant",&local_89f);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3e8,&local_768,&invariant);
  std::__cxx11::string::string(local_788,"use safe/importance aware updates.",&local_8a0);
  std::__cxx11::string::_M_assign((string *)(local_3e8 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_3e8);
  std::__cxx11::string::string((string *)&local_7a8,"normalized",&local_8a1);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2a8,&local_7a8,&normalized);
  std::__cxx11::string::string(local_7c8,"use per feature normalized updates",&local_8a2);
  std::__cxx11::string::_M_assign((string *)(local_2a8 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_2a8);
  std::__cxx11::string::string((string *)&local_7e8,"sparse_l2",&local_8a3);
  VW::config::typed_option<float>::typed_option
            (&local_c8,&local_7e8,
             &(g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl)->sparse_l2);
  op = VW::config::typed_option<float>::default_value(&local_c8,0.0);
  std::__cxx11::string::string(local_808,"use per feature normalized updates",&local_8a4);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar7,op);
  std::__cxx11::string::string((string *)&local_828,"l1_state",&local_8a5);
  VW::config::typed_option<double>::typed_option(&local_168,&local_828,&all->sd->gravity);
  local_168.super_base_option.m_keep = all->save_resume;
  ptVar8 = VW::config::typed_option<double>::default_value(&local_168,0.0);
  std::__cxx11::string::string(local_848,"use per feature normalized updates",&local_8a6);
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<double>&>
                     (poVar7,ptVar8);
  std::__cxx11::string::string((string *)&local_868,"l2_state",&local_8a7);
  VW::config::typed_option<double>::typed_option(&local_208,&local_868,&all->sd->contraction);
  local_208.super_base_option.m_keep = all->save_resume;
  ptVar8 = VW::config::typed_option<double>::default_value(&local_208,1.0);
  std::__cxx11::string::string(local_888,"use per feature normalized updates",&local_8a8);
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<double>&>(poVar7,ptVar8);
  std::__cxx11::string::~string(local_888);
  VW::config::typed_option<double>::~typed_option(&local_208);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string(local_848);
  VW::config::typed_option<double>::~typed_option(&local_168);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string(local_808);
  VW::config::typed_option<float>::~typed_option(&local_c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string(local_7c8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_2a8);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string(local_788);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_3e8);
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string(local_748);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_348);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string(local_708);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_610);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string(local_6c8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&local_6a8);
  (**options->_vptr_options_i)(options,&new_options);
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->all = all;
  all->normalized_sum_norm_x = 0.0;
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->no_win_counter = 0;
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->total_weight = 0.0;
  fVar20 = -1.0;
  if (all->adaptive != false) {
    fVar20 = all->power_t + -1.0;
  }
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->neg_norm_power = fVar20;
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->neg_power_t = -all->power_t;
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->adaptive = all->adaptive;
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->normalized = all->normalized_updates;
  if (0.0 < all->initial_t) {
    (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->all->normalized_sum_norm_x = (double)all->initial_t;
    (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->total_weight = (double)all->initial_t;
  }
  std::__cxx11::string::string((string *)&__msg,"feature_mask",(allocator *)local_610);
  iVar5 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if (all->holdout_set_off == false) {
    all->sd->holdout_best_loss = 3.4028234663852886e+38;
    std::__cxx11::string::string((string *)&__msg,"early_terminate",(allocator *)local_610);
    ptVar9 = VW::config::options_i::get_typed_option<unsigned_long>(options,(string *)&__msg);
    peVar1 = (ptVar9->m_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      eVar10 = 0;
    }
    else {
      eVar10 = *peVar1;
    }
    (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->early_stop_thres = eVar10;
    std::__cxx11::string::~string((string *)&__msg);
  }
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->initial_constant = all->initial_constant;
  if ((((sgd == true) || ((adaptive & 1U) != 0)) || ((invariant & 1U) != 0)) || (normalized == true)
     ) {
    bVar19 = all->training == false;
    bVar18 = adaptive;
    if (bVar19) {
      bVar18 = false;
    }
    all->adaptive = bVar18;
    bVar18 = invariant;
    if (bVar19) {
      bVar18 = false;
    }
    all->invariant_updates = bVar18;
    bVar18 = normalized;
    if (bVar19) {
      bVar18 = false;
    }
    all->normalized_updates = bVar18;
    std::__cxx11::string::string((string *)&__msg,"learning_rate",(allocator *)local_348);
    iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
    if ((char)iVar6 == '\0') {
      std::__cxx11::string::string((string *)local_610,"l",(allocator *)local_3e8);
      iVar6 = (*options->_vptr_options_i[1])(options,local_610);
      if ((char)iVar6 != '\0') {
        std::__cxx11::string::~string((string *)local_610);
        goto LAB_00131f8e;
      }
      bVar18 = all->adaptive;
      bVar19 = all->normalized_updates;
      std::__cxx11::string::~string((string *)local_610);
      std::__cxx11::string::~string((string *)&__msg);
      if ((bVar18 != true) || ((bVar19 & 1U) == 0)) {
        all->eta = 10.0;
      }
    }
    else {
LAB_00131f8e:
      std::__cxx11::string::~string((string *)&__msg);
    }
    if ((all->adaptive == false) && (all->normalized_updates == false)) {
      std::__cxx11::string::string((string *)&__msg,"initial_t",(allocator *)local_610);
      iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      if ((char)iVar6 == '\0') {
        all->sd->t = 1.0;
        all->initial_t = 1.0;
      }
      fVar20 = powf((float)all->sd->t,all->power_t);
      all->eta = fVar20 * all->eta;
    }
  }
  else {
    bVar18 = all->training;
    all->adaptive = bVar18;
    all->invariant_updates = bVar18;
    all->normalized_updates = bVar18;
  }
  if (adax == false) {
    bVar4 = (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
             super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl)->adax;
  }
  else {
    bVar4 = all->training;
    (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->adax = (bool)bVar4;
  }
  if (((bVar4 & 1) != 0) && (all->adaptive == false)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    std::operator<<((ostream *)local_560,"Cannot use adax without adaptive");
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/gd.cc"
               ,0x48e,&local_668);
    __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  dVar21 = pow((double)all->eta_decay_rate,
               ((double)CONCAT44(0x45300000,(int)(all->numpasses >> 0x20)) - 1.9342813113834067e+25)
               + ((double)CONCAT44(0x43300000,(int)all->numpasses) - 4503599627370496.0));
  if (dVar21 < 0.0001) {
    std::operator<<(&(all->trace_message).super_ostream,
                    "Warning: the learning rate for the last pass is multiplied by: ");
    dVar21 = pow((double)all->eta_decay_rate,
                 ((double)CONCAT44(0x45300000,(int)(all->numpasses >> 0x20)) -
                 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)all->numpasses) - 4503599627370496.0));
    poVar11 = std::ostream::_M_insert<double>(dVar21);
    poVar11 = std::operator<<(poVar11," adjust --decay_learning_rate larger to avoid this.");
    std::endl<char,std::char_traits<char>>(poVar11);
  }
  if ((all->reg_mode & 1) == 0) {
    if (all->audit != false) {
      pcVar12 = predict<false,true>;
      pcVar15 = multipredict<false,true>;
      goto LAB_001321f1;
    }
    pcVar12 = predict<false,false>;
    bVar18 = all->hash_inv == false;
    if (!bVar18) {
      pcVar12 = predict<false,true>;
    }
    pcVar17 = multipredict<false,true>;
    pcVar15 = multipredict<false,false>;
  }
  else {
    if (all->audit != false) {
      pcVar15 = multipredict<true,true>;
      pcVar12 = predict<true,true>;
      goto LAB_001321f1;
    }
    pcVar12 = predict<true,false>;
    bVar18 = all->hash_inv == false;
    if (!bVar18) {
      pcVar12 = predict<true,true>;
    }
    pcVar17 = multipredict<true,true>;
    pcVar15 = multipredict<true,false>;
  }
  if (!bVar18) {
    pcVar15 = pcVar17;
  }
LAB_001321f1:
  bVar18 = (bool)((byte)iVar5 ^ 1);
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->predict = pcVar12;
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->multipredict = pcVar15;
  if ((all->power_t != 0.5) || (NAN(all->power_t))) {
    uVar13 = set_learn<false>(all,bVar18,
                              g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                              super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                              super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl);
  }
  else {
    uVar13 = set_learn<true>(all,bVar18,
                             g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                             super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                             super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl);
  }
  uVar13 = ceil_log_2(uVar13 - 1);
  parameters::stride_shift(&all->weights,(uint32_t)uVar13);
  puVar16 = &(all->weights).dense_weights._stride_shift;
  if ((all->weights).sparse != false) {
    puVar16 = &(all->weights).sparse_weights._stride_shift;
  }
  plVar14 = LEARNER::init_learner<GD::gd,example,LEARNER::learner<char,char>>
                      (&g,(_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr *)
                          (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl)->learn,
                       (_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr *)
                       (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl)->predict,
                       1L << ((byte)*puVar16 & 0x3f));
  p_Var2 = (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
            super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl)->sensitivity;
  uVar3 = *(undefined8 *)(plVar14 + 0x18);
  *(undefined8 *)(plVar14 + 0x48) = uVar3;
  *(_func_float_gd_ptr_base_learner_ptr_example_ptr **)(plVar14 + 0x50) = p_Var2;
  *(_func_void_gd_ptr_base_learner_ptr_example_ptr_size_t_size_t_polyprediction_ptr_bool **)
   (plVar14 + 0x40) =
       (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
        super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
       _M_head_impl)->multipredict;
  *(_func_void_gd_ptr_base_learner_ptr_example_ptr **)(plVar14 + 0x38) =
       (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
        super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
       _M_head_impl)->update;
  *(code **)(plVar14 + 0x80) = save_load;
  *(undefined8 *)(plVar14 + 0x70) = uVar3;
  *(undefined8 *)(plVar14 + 0x78) = *(undefined8 *)(plVar14 + 0x20);
  *(undefined8 *)(plVar14 + 0x88) = uVar3;
  *(undefined8 *)(plVar14 + 0x90) = *(undefined8 *)(plVar14 + 0x20);
  *(code **)(plVar14 + 0x98) = end_pass;
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<GD::gd,_void_(*)(void_*)>::~unique_ptr(&g);
  return (base_learner *)plVar14;
}

Assistant:

base_learner* setup(options_i& options, vw& all)
{
  auto g = scoped_calloc_or_throw<gd>();

  bool sgd = false;
  bool adaptive = false;
  bool adax = false;
  bool invariant = false;
  bool normalized = false;

  option_group_definition new_options("Gradient Descent options");
  new_options.add(make_option("sgd", sgd).help("use regular stochastic gradient descent update."))
      .add(make_option("adaptive", adaptive).help("use adaptive, individual learning rates."))
      .add(make_option("adax", adax).help("use adaptive learning rates with x^2 instead of g^2x^2"))
      .add(make_option("invariant", invariant).help("use safe/importance aware updates."))
      .add(make_option("normalized", normalized).help("use per feature normalized updates"))
      .add(make_option("sparse_l2", g->sparse_l2).default_value(0.f).help("use per feature normalized updates"))
      .add(make_option("l1_state", all.sd->gravity)
               .keep(all.save_resume)
               .default_value(0.)
               .help("use per feature normalized updates"))
      .add(make_option("l2_state", all.sd->contraction)
               .keep(all.save_resume)
               .default_value(1.)
               .help("use per feature normalized updates"));
  options.add_and_parse(new_options);

  g->all = &all;
  g->all->normalized_sum_norm_x = 0;
  g->no_win_counter = 0;
  g->total_weight = 0.;
  g->neg_norm_power = (all.adaptive ? (all.power_t - 1.f) : -1.f);
  g->neg_power_t = -all.power_t;
  g->adaptive = all.adaptive;
  g->normalized = all.normalized_updates;

  if (all.initial_t > 0)  // for the normalized update: if initial_t is bigger than 1 we interpret this as if we had
                          // seen (all.initial_t) previous fake datapoints all with norm 1
  {
    g->all->normalized_sum_norm_x = all.initial_t;
    g->total_weight = all.initial_t;
  }

  bool feature_mask_off = true;
  if (options.was_supplied("feature_mask"))
    feature_mask_off = false;

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    g->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  g->initial_constant = all.initial_constant;

  if (sgd || adaptive || invariant || normalized)
  {
    // nondefault
    all.adaptive = all.training && adaptive;
    all.invariant_updates = all.training && invariant;
    all.normalized_updates = all.training && normalized;

    if (!options.was_supplied("learning_rate") && !options.was_supplied("l") &&
        !(all.adaptive && all.normalized_updates))
      all.eta = 10;  // default learning rate to 10 for non default update rule

    // if not using normalized or adaptive, default initial_t to 1 instead of 0
    if (!all.adaptive && !all.normalized_updates)
    {
      if (!options.was_supplied("initial_t"))
      {
        all.sd->t = 1.f;
        all.initial_t = 1.f;
      }
      all.eta *= powf((float)(all.sd->t), all.power_t);
    }
  }
  else
  {
    all.adaptive = all.training;
    all.invariant_updates = all.training;
    all.normalized_updates = all.training;
  }

  if (adax)
    g->adax = all.training && adax;

  if (g->adax && !all.adaptive)
    THROW("Cannot use adax without adaptive");

  if (pow((double)all.eta_decay_rate, (double)all.numpasses) < 0.0001)
    all.trace_message << "Warning: the learning rate for the last pass is multiplied by: "
                      << pow((double)all.eta_decay_rate, (double)all.numpasses)
                      << " adjust --decay_learning_rate larger to avoid this." << endl;

  if (all.reg_mode % 2)
    if (all.audit || all.hash_inv)
    {
      g->predict = predict<true, true>;
      g->multipredict = multipredict<true, true>;
    }
    else
    {
      g->predict = predict<true, false>;
      g->multipredict = multipredict<true, false>;
    }
  else if (all.audit || all.hash_inv)
  {
    g->predict = predict<false, true>;
    g->multipredict = multipredict<false, true>;
  }
  else
  {
    g->predict = predict<false, false>;
    g->multipredict = multipredict<false, false>;
  }

  uint64_t stride;
  if (all.power_t == 0.5)
    stride = set_learn<true>(all, feature_mask_off, *g.get());
  else
    stride = set_learn<false>(all, feature_mask_off, *g.get());

  all.weights.stride_shift((uint32_t)ceil_log_2(stride - 1));

  gd* bare = g.get();
  learner<gd, example>& ret = init_learner(g, g->learn, bare->predict, ((uint64_t)1 << all.weights.stride_shift()));
  ret.set_sensitivity(bare->sensitivity);
  ret.set_multipredict(bare->multipredict);
  ret.set_update(bare->update);
  ret.set_save_load(save_load);
  ret.set_end_pass(end_pass);
  return make_base(ret);
}